

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

put_transaction<Func> * __thiscall
density::
heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
::
start_emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Func>
          (put_transaction<Func> *__return_storage_ptr__,
          heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
          *this)

{
  FunctionRuntimeType<(density::function_type_erasure)1,_void_()> *pFVar1;
  FunctionRuntimeType<(density::function_type_erasure)1,_void_()> FVar2;
  put_transaction<Func> local_50;
  FunctionRuntimeType<(density::function_type_erasure)1,_void_()> *local_38;
  FunctionRuntimeType<(density::function_type_erasure)1,_void_()> *type_storage;
  FunctionRuntimeType<(density::function_type_erasure)1,_void_()> *type;
  Allocation push_data;
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  *this_local;
  
  push_data.m_user_storage = this;
  _type = inplace_allocate<0ul,true,16ul,8ul>(this);
  type_storage = (FunctionRuntimeType<(density::function_type_erasure)1,_void_()> *)0x0;
  pFVar1 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::type_after_control((ControlBlock *)type);
  local_38 = pFVar1;
  FVar2 = detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>::make<Func>();
  pFVar1->m_align_invoke_destroy = FVar2.m_align_invoke_destroy;
  type_storage = pFVar1;
  memset(push_data.m_control_block,0,0x10);
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<Func>::put_transaction
            (&local_50,0,
             (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
              *)this,_type);
  put_transaction<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Func>
  ::
  put_transaction<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Func,void>
            ((put_transaction<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Func>
              *)__return_storage_ptr__,&local_50);
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<Func>::~put_transaction(&local_50);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<ELEMENT_TYPE> start_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            auto push_data = inplace_allocate<
              0,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>();

            RUNTIME_TYPE * type = nullptr;
            try
            {
                auto const type_storage = type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) RUNTIME_TYPE(RUNTIME_TYPE::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();
                DENSITY_ASSERT_INTERNAL(
                  (push_data.m_control_block->m_next & (detail::Queue_Busy | detail::Queue_Dead)) ==
                  0);
                push_data.m_control_block->m_next += detail::Queue_Dead;
                throw;
            }

            return put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }